

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::RALocalAllocator::RALocalAllocator(RALocalAllocator *this,BaseRAPass *pass)

{
  undefined8 uVar1;
  
  this->_pass = pass;
  this->_cc = (BaseCompiler *)(pass->super_FuncPass).super_Pass._cb;
  this->_archTraits = pass->_archTraits;
  uVar1 = *(undefined8 *)((pass->_availableRegs)._masks._data + 2);
  *(undefined8 *)(this->_availableRegs)._masks._data =
       *(undefined8 *)(pass->_availableRegs)._masks._data;
  *(undefined8 *)((this->_availableRegs)._masks._data + 2) = uVar1;
  (this->_clobberedRegs)._masks._data[0] = 0;
  (this->_clobberedRegs)._masks._data[1] = 0;
  (this->_clobberedRegs)._masks._data[2] = 0;
  (this->_clobberedRegs)._masks._data[3] = 0;
  (this->_funcPreservedRegs)._masks._data[0] = 0;
  (this->_funcPreservedRegs)._masks._data[1] = 0;
  (this->_funcPreservedRegs)._masks._data[2] = 0;
  (this->_funcPreservedRegs)._masks._data[3] = 0;
  RAAssignment::RAAssignment(&this->_curAssignment);
  RAAssignment::RAAssignment(&this->_tmpAssignment);
  this->_raInst = (RAInst *)0x0;
  this->_tiedTotal = 0;
  this->_tiedCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  this->_tmpWorkToPhysMap = (WorkToPhysMap *)0x0;
  this->_block = (RABlock *)0x0;
  this->_node = (InstNode *)0x0;
  uVar1 = *(undefined8 *)((pass->_func->_frame)._preservedRegs._data + 2);
  *(undefined8 *)(this->_funcPreservedRegs)._masks._data =
       *(undefined8 *)(pass->_func->_frame)._preservedRegs._data;
  *(undefined8 *)((this->_funcPreservedRegs)._masks._data + 2) = uVar1;
  return;
}

Assistant:

inline explicit RALocalAllocator(BaseRAPass* pass) noexcept
    : _pass(pass),
      _cc(pass->cc()),
      _archTraits(pass->_archTraits),
      _availableRegs(pass->_availableRegs) {
    _funcPreservedRegs.init(pass->func()->frame().preservedRegs());
  }